

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.cpp
# Opt level: O2

string * nite::getCWD_abi_cxx11_(void)

{
  string *in_RDI;
  char local_1028 [8];
  char CurrentPath [4096];
  allocator local_19;
  
  getcwd(local_1028,0x1000);
  std::__cxx11::string::string((string *)in_RDI,local_1028,&local_19);
  return in_RDI;
}

Assistant:

String nite::getCWD(){
	char CurrentPath[FILENAME_MAX];
	CWD(CurrentPath, sizeof(CurrentPath));
	return CurrentPath;
}